

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::consumeLineBreakIfPresent(Scanner *this)

{
  iterator pcVar1;
  bool bVar2;
  iterator Next;
  Scanner *this_local;
  
  pcVar1 = skip_b_break(this,this->Current);
  bVar2 = pcVar1 != this->Current;
  if (bVar2) {
    this->Column = 0;
    this->Line = this->Line + 1;
    this->Current = pcVar1;
  }
  return bVar2;
}

Assistant:

bool Scanner::consumeLineBreakIfPresent() {
  auto Next = skip_b_break(Current);
  if (Next == Current)
    return false;
  Column = 0;
  ++Line;
  Current = Next;
  return true;
}